

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O3

void __thiscall Js::BigUInt::ShiftRight(BigUInt *this,int32 cbit)

{
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  sbyte sVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  AssertValid(this,true);
  if (cbit < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x11c,"(cbit >= 0)","cbit >= 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (0 < cbit >> 5) {
    ShiftLusRight(this,cbit >> 5);
  }
  if (((cbit & 0x1fU) != 0) && (this->m_clu != 0)) {
    puVar1 = this->m_prglu;
    sVar5 = (sbyte)(cbit & 0x1fU);
    uVar7 = *puVar1 >> sVar5;
    *puVar1 = uVar7;
    iVar6 = this->m_clu;
    if (1 < iVar6) {
      lVar8 = 1;
      do {
        puVar1[lVar8 + -1] = puVar1[lVar8] << (0x20U - sVar5 & 0x1f) | uVar7;
        uVar7 = puVar1[lVar8] >> sVar5;
        puVar1[lVar8] = uVar7;
        lVar8 = lVar8 + 1;
        iVar6 = this->m_clu;
      } while (lVar8 < iVar6);
    }
    if (uVar7 == 0) {
      this->m_clu = iVar6 + -1;
    }
  }
  AssertValid(this,true);
  return;
}

Assistant:

void BigUInt::ShiftRight(int32 cbit)
    {
        AssertBi(this);
        Assert(cbit >= 0);

        int32 ilu;
        int32 clu = cbit >> 5;
        cbit &= 0x001F;

        if (clu > 0)
            ShiftLusRight(clu);

        if (cbit == 0 || m_clu == 0)
        {
            AssertBi(this);
            return;
        }

        for (ilu = 0; ; )
        {
            m_prglu[ilu] >>= cbit;
            if (++ilu >= m_clu)
            {
            // Last one.
                if (0 == m_prglu[ilu - 1])
                    m_clu--;
                break;
            }
            m_prglu[ilu - 1] |= m_prglu[ilu] << (32 - cbit);
        }

        AssertBi(this);
    }